

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::checkAndLogProgram
               (ShaderProgram *program,Program *programDefinition,Functions *gl,TestLog *log)

{
  ostringstream *this;
  TestError *this_00;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  ScopedLogSection section;
  string local_1c8;
  MessageBuilder local_1a8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Program",&local_1d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"Program",&local_1d2);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&local_1a8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  glu::operator<<(log,program);
  if ((program->m_program).m_info.linkOk != false) {
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    return;
  }
  this = &local_1a8.m_str;
  local_1a8.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,
                  "Program build failed, checking if program exceeded implementation limits");
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  checkProgramResourceUsage(programDefinition,gl,log);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"could not build program",(allocator<char> *)&local_1c8);
  tcu::TestError::TestError(this_00,(string *)&local_1a8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkAndLogProgram (const glu::ShaderProgram& program, const ProgramInterfaceDefinition::Program* programDefinition, const glw::Functions& gl, tcu::TestLog& log)
{
	const tcu::ScopedLogSection section(log, "Program", "Program");

	log << program;
	if (!program.isOk())
	{
		log << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
		checkProgramResourceUsage(programDefinition, gl, log);

		// within limits
		throw tcu::TestError("could not build program");
	}
}